

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictoc.h
# Opt level: O2

void __thiscall bsplib::TicToc::~TicToc(TicToc *this)

{
  long *plVar1;
  __time_t _Var2;
  __syscall_slong_t _Var3;
  undefined1 auVar4 [16];
  long lVar5;
  long lVar6;
  long lVar7;
  Time TVar8;
  Time a;
  
  lVar6 = s_timers;
  lVar7 = (ulong)this->m_record * 0x20;
  _Var2 = *(__time_t *)(s_timers + lVar7);
  _Var3 = *(__syscall_slong_t *)(s_timers + 8 + lVar7);
  TVar8 = getTime();
  TVar8 = timeDiff(TVar8,this->m_start);
  a.tv_nsec = _Var3;
  a.tv_sec = _Var2;
  TVar8 = timeAdd(a,TVar8);
  *(__time_t *)(lVar6 + lVar7) = TVar8.tv_sec;
  *(__syscall_slong_t *)(lVar6 + 8 + lVar7) = TVar8.tv_nsec;
  plVar1 = (long *)(lVar6 + 0x10 + lVar7);
  lVar5 = plVar1[1] + 1;
  auVar4._8_4_ = (int)lVar5;
  auVar4._0_8_ = this->m_nbytes + *plVar1;
  auVar4._12_4_ = (int)((ulong)lVar5 >> 0x20);
  *(undefined1 (*) [16])(lVar6 + 0x10 + lVar7) = auVar4;
  pop();
  return;
}

Assistant:

~TicToc()
    {
        Record & r = s_timers[m_record];
        r.time = timeAdd( r.time, 
                timeDiff( getTime(), m_start ) );
        r.nbytes += m_nbytes;
        r.count += 1;
        pop();
    }